

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O0

void accumulate_sse_sum(__m256i regx_sum,__m256i regx2_sum,int *x_sum,int64_t *x2_sum)

{
  undefined1 auVar1 [32];
  long *in_RSI;
  int *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  __m128i out_buffer;
  __m256i sse_buffer;
  __m256i sum_buffer;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_60;
  
  local_200._8_8_ = in_XMM0_Qb;
  local_200._0_8_ = in_XMM0_Qa;
  local_200._16_8_ = in_YMM0_H;
  local_200._24_8_ = in_register_00001218;
  local_220._8_8_ = in_XMM1_Qb;
  local_220._0_8_ = in_XMM1_Qa;
  local_220._16_8_ = in_YMM1_H;
  local_220._24_8_ = in_register_00001258;
  auVar1 = vpermq_avx2(local_200,0x4e);
  auVar2._16_8_ = in_YMM0_H;
  auVar2._0_16_ = local_200._0_16_;
  auVar2._24_8_ = in_register_00001218;
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpsrldq_avx2(auVar1,8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpsrldq_avx2(auVar1,4);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpermq_avx2(local_220,0x4e);
  auVar3._16_8_ = in_YMM1_H;
  auVar3._0_16_ = local_220._0_16_;
  auVar3._24_8_ = in_register_00001258;
  auVar2 = vpaddq_avx2(auVar2,auVar3);
  auVar3 = vpsrldq_avx2(auVar2,8);
  auVar2 = vpaddq_avx2(auVar2,auVar3);
  local_60 = auVar1._0_4_;
  *in_RDI = *in_RDI + local_60;
  local_220._0_8_ = auVar2._0_8_;
  *in_RSI = local_220._0_8_ + *in_RSI;
  return;
}

Assistant:

static inline void accumulate_sse_sum(__m256i regx_sum, __m256i regx2_sum,
                                      int *x_sum, int64_t *x2_sum) {
  __m256i sum_buffer, sse_buffer;
  __m128i out_buffer;

  // Accumulate the various elements of register into first element.
  sum_buffer = _mm256_permute2f128_si256(regx_sum, regx_sum, 1);
  regx_sum = _mm256_add_epi32(sum_buffer, regx_sum);
  regx_sum = _mm256_add_epi32(regx_sum, _mm256_srli_si256(regx_sum, 8));
  regx_sum = _mm256_add_epi32(regx_sum, _mm256_srli_si256(regx_sum, 4));

  sse_buffer = _mm256_permute2f128_si256(regx2_sum, regx2_sum, 1);
  regx2_sum = _mm256_add_epi64(sse_buffer, regx2_sum);
  regx2_sum = _mm256_add_epi64(regx2_sum, _mm256_srli_si256(regx2_sum, 8));

  out_buffer = _mm256_castsi256_si128(regx_sum);
  *x_sum += _mm_cvtsi128_si32(out_buffer);
  out_buffer = _mm256_castsi256_si128(regx2_sum);
#if AOM_ARCH_X86_64
  *x2_sum += _mm_cvtsi128_si64(out_buffer);
#else
  {
    int64_t tmp;
    _mm_storel_epi64((__m128i *)&tmp, out_buffer);
    *x2_sum += tmp;
  }
#endif
}